

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeSetPagerFlags(Btree *p,uint pgFlags)

{
  byte bVar1;
  BtShared *pBVar2;
  Pager *pPVar3;
  int extraout_EAX;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  pBVar2 = p->pBt;
  sqlite3BtreeEnter(p);
  pPVar3 = pBVar2->pPager;
  if (pPVar3->tempFile == '\0') {
    uVar6 = pgFlags & 7;
    bVar8 = uVar6 == 1;
    bVar7 = 2 < uVar6;
    bVar9 = uVar6 == 4;
  }
  else {
    bVar8 = true;
    bVar7 = false;
    bVar9 = false;
  }
  pPVar3->noSync = bVar8;
  pPVar3->fullSync = bVar7;
  pPVar3->extraSync = bVar9;
  if (bVar8 == false) {
    if ((pgFlags & 8) == 0) {
      pPVar3->syncFlags = '\x02';
      bVar5 = 2;
    }
    else {
      pPVar3->syncFlags = '\x03';
      bVar5 = 3;
    }
  }
  else {
    pPVar3->syncFlags = '\0';
    bVar5 = 0;
  }
  bVar1 = bVar5 * '\x04';
  if (bVar7 == false) {
    bVar5 = 0;
  }
  bVar4 = 0xc;
  if (bVar8 != false) {
    bVar4 = bVar1;
  }
  if ((pgFlags & 0x10) == 0) {
    bVar4 = bVar1;
  }
  pPVar3->walSyncFlags = bVar4 | bVar5;
  pPVar3->doNotSpill = pPVar3->doNotSpill & 0xfe | (pgFlags & 0x20) == 0;
  sqlite3BtreeLeave(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPagerFlags(
  Btree *p,              /* The btree to set the safety level on */
  unsigned pgFlags       /* Various PAGER_* flags */
){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBt->pPager, pgFlags);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}